

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_78567::DiskInterfaceTestRemoveFile::Run(DiskInterfaceTestRemoveFile *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  RealDiskInterface *this_00;
  char *in_RSI;
  allocator<char> local_39;
  string local_38;
  
  pTVar1 = g_current_test;
  bVar2 = DiskInterfaceTest::Touch((DiskInterfaceTest *)"file-to-remove",in_RSI);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                     ,0xd2,"Touch(kFileName)");
  pTVar1 = g_current_test;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"file-to-remove",&local_39);
    this_00 = &(this->super_DiskInterfaceTest).disk_;
    iVar3 = RealDiskInterface::RemoveFile(this_00,&local_38);
    testing::Test::Check
              (pTVar1,iVar3 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0xd3,"0 == disk_.RemoveFile(kFileName)");
    std::__cxx11::string::~string((string *)&local_38);
    pTVar1 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"file-to-remove",&local_39);
    iVar3 = RealDiskInterface::RemoveFile(this_00,&local_38);
    testing::Test::Check
              (pTVar1,iVar3 == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0xd4,"1 == disk_.RemoveFile(kFileName)");
    std::__cxx11::string::~string((string *)&local_38);
    pTVar1 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"does not exist",&local_39);
    iVar3 = RealDiskInterface::RemoveFile(this_00,&local_38);
    testing::Test::Check
              (pTVar1,iVar3 == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0xd5,"1 == disk_.RemoveFile(\"does not exist\")");
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, RemoveFile) {
  const char* kFileName = "file-to-remove";
  ASSERT_TRUE(Touch(kFileName));
  EXPECT_EQ(0, disk_.RemoveFile(kFileName));
  EXPECT_EQ(1, disk_.RemoveFile(kFileName));
  EXPECT_EQ(1, disk_.RemoveFile("does not exist"));
#ifdef _WIN32
  ASSERT_TRUE(Touch(kFileName));
  EXPECT_EQ(0, system((std::string("attrib +R ") + kFileName).c_str()));
  EXPECT_EQ(0, disk_.RemoveFile(kFileName));
  EXPECT_EQ(1, disk_.RemoveFile(kFileName));
#endif
}